

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O3

adios2_error adios2_perform_puts(adios2_engine *engine)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"for adios2_engine, in call to adios2_perform_puts","");
  adios2::helper::CheckForNullptr<adios2_engine>(engine,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (**(code **)(*(long *)engine + 0x30))(engine);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_perform_puts(adios2_engine *engine)
{
    try
    {
        adios2::helper::CheckForNullptr(engine,
                                        "for adios2_engine, in call to adios2_perform_puts");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        engineCpp->PerformPuts();
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_perform_puts"));
    }
}